

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementScroll.cpp
# Opt level: O2

void __thiscall
Rml::ElementScroll::EnableScrollbar(ElementScroll *this,Orientation orientation,float element_width)

{
  Element *this_00;
  Vector2f VVar1;
  ComputedValues *pCVar2;
  Scrollbar *pSVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  Box box;
  
  pSVar3 = this->scrollbars + orientation;
  if (this->scrollbars[orientation].enabled == false) {
    CreateScrollbar(this,orientation);
    this_00 = pSVar3->element;
    Property::Property<Rml::Style::Visibility,Rml::Style::Visibility>((Property *)&box,Visible);
    Element::SetProperty(this_00,Visibility,(Property *)&box);
    Property::~Property((Property *)&box);
    this->scrollbars[orientation].enabled = true;
  }
  Box::Box(&box);
  VVar1.y = element_width;
  VVar1.x = element_width;
  LayoutDetails::BuildBox(&box,VVar1,pSVar3->element,Block);
  if (orientation == HORIZONTAL) {
    VVar1 = Box::GetSize(&box);
    if (0.0 <= VVar1.y) {
      VVar1 = Box::GetSize(&box,Margin);
      fVar6 = VVar1.y;
    }
    else {
      fVar4 = Box::GetCumulativeEdge(&box,Content,Left);
      fVar5 = Box::GetCumulativeEdge(&box,Content,Right);
      pCVar2 = Element::GetComputedValues(pSVar3->element);
      fVar6 = ResolveValue((LengthPercentageAuto)
                           (CONCAT44((pCVar2->common).height_value,*(uint *)&pCVar2->common >> 0x13)
                           & 0xffffffff00000003),element_width);
      fVar6 = fVar4 + fVar5 + fVar6;
    }
  }
  else {
    if (orientation != VERTICAL) goto LAB_00292e3c;
    VVar1 = Box::GetSize(&box,Margin);
    fVar6 = VVar1.x;
  }
  this->scrollbars[orientation].size = fVar6;
LAB_00292e3c:
  Box::~Box(&box);
  return;
}

Assistant:

void ElementScroll::EnableScrollbar(Orientation orientation, float element_width)
{
	if (!scrollbars[orientation].enabled)
	{
		CreateScrollbar(orientation);
		scrollbars[orientation].element->SetProperty(PropertyId::Visibility, Property(Style::Visibility::Visible));
		scrollbars[orientation].enabled = true;
	}

	// Determine the size of the scrollbar.
	Box box;
	LayoutDetails::BuildBox(box, Vector2f(element_width, element_width), scrollbars[orientation].element);

	if (orientation == VERTICAL)
		scrollbars[orientation].size = box.GetSize(BoxArea::Margin).x;
	if (orientation == HORIZONTAL)
	{
		if (box.GetSize().y < 0)
			scrollbars[orientation].size = box.GetCumulativeEdge(BoxArea::Content, BoxEdge::Left) +
				box.GetCumulativeEdge(BoxArea::Content, BoxEdge::Right) +
				ResolveValue(scrollbars[orientation].element->GetComputedValues().height(), element_width);
		else
			scrollbars[orientation].size = box.GetSize(BoxArea::Margin).y;
	}
}